

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_encoder.c
# Opt level: O1

int pt_encoder_init(pt_encoder *encoder,pt_config *config)

{
  int iVar1;
  
  if (encoder == (pt_encoder *)0x0) {
    iVar1 = -2;
  }
  else {
    memset(encoder,0,0x120);
    iVar1 = pt_config_from_user(&encoder->config,config);
    if (-1 < iVar1) {
      encoder->pos = (encoder->config).begin;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int pt_encoder_init(struct pt_encoder *encoder, const struct pt_config *config)
{
	int errcode;

	if (!encoder)
		return -pte_invalid;

	memset(encoder, 0, sizeof(*encoder));

	errcode = pt_config_from_user(&encoder->config, config);
	if (errcode < 0)
		return errcode;

	encoder->pos = encoder->config.begin;

	return 0;
}